

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wave.cpp
# Opt level: O1

int __thiscall anon_unknown.dwarf_2ae9e6::WaveBackend::mixerProc(WaveBackend *this)

{
  uint uVar1;
  ALuint AVar2;
  ALCdevice *pAVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  int *piVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  long local_58;
  timespec local_40;
  
  pAVar3 = (this->super_BackendBase).mDevice;
  uVar1 = pAVar3->Frequency;
  AVar2 = pAVar3->UpdateSize;
  althrd_setname("alsoft-mixer");
  pAVar3 = (this->super_BackendBase).mDevice;
  uVar6 = ChannelsFromDevFmt(pAVar3->FmtChans,pAVar3->mAmbiOrder);
  pAVar3 = (this->super_BackendBase).mDevice;
  uVar7 = BytesFromDevFmt(pAVar3->FmtType);
  uVar8 = ChannelsFromDevFmt(pAVar3->FmtChans,pAVar3->mAmbiOrder);
  local_58 = std::chrono::_V2::steady_clock::now();
  if (((this->mKillNow)._M_base._M_i & 1U) == 0) {
    uVar4 = (ulong)(AVar2 * 1000) / (ulong)uVar1;
    uVar5 = uVar4 >> 1;
    uVar15 = 0;
    do {
      if (((((this->super_BackendBase).mDevice)->Connected)._M_base._M_i & 1U) == 0) {
        return 0;
      }
      lVar10 = std::chrono::_V2::steady_clock::now();
      pAVar3 = (this->super_BackendBase).mDevice;
      lVar10 = (long)((lVar10 - local_58) * (ulong)pAVar3->Frequency) / 1000000000;
      lVar11 = lVar10 - uVar15;
      if (lVar11 < (long)(ulong)pAVar3->UpdateSize) {
        if (1 < (uint)uVar4) {
          local_40.tv_sec = uVar5 / 1000;
          local_40.tv_nsec = (uVar5 % 1000) * 1000000;
          do {
            iVar9 = nanosleep(&local_40,&local_40);
            if (iVar9 != -1) break;
            piVar12 = __errno_location();
          } while (*piVar12 == 4);
        }
      }
      else {
        while( true ) {
          pAVar3 = (this->super_BackendBase).mDevice;
          uVar1 = pAVar3->UpdateSize;
          if (lVar11 < (long)(ulong)uVar1) break;
          ALCdevice::renderSamples
                    (pAVar3,(this->mBuffer).
                            super__Vector_base<al::byte,_al::allocator<al::byte,_1UL>_>._M_impl.
                            super__Vector_impl_data._M_start,uVar1,(ulong)uVar6);
          uVar14 = (ulong)((this->super_BackendBase).mDevice)->UpdateSize;
          uVar15 = uVar15 + uVar14;
          fwrite((this->mBuffer).super__Vector_base<al::byte,_al::allocator<al::byte,_1UL>_>._M_impl
                 .super__Vector_impl_data._M_start,(ulong)(uVar8 * uVar7),uVar14,(FILE *)this->mFile
                );
          iVar9 = ferror((FILE *)this->mFile);
          if (iVar9 != 0) {
            if (0 < (int)gLogLevel) {
              _GLOBAL__N_1::WaveBackend::mixerProc();
            }
            ALCdevice::handleDisconnect
                      ((this->super_BackendBase).mDevice,"Failed to write playback samples");
            if (iVar9 != 0) break;
          }
          lVar11 = lVar10 - uVar15;
        }
        uVar14 = (ulong)((this->super_BackendBase).mDevice)->Frequency;
        if ((long)uVar14 <= (long)uVar15) {
          uVar13 = uVar15 / uVar14;
          uVar15 = uVar15 % uVar14;
          local_58 = local_58 + uVar13 * 1000000000;
        }
      }
    } while (((this->mKillNow)._M_base._M_i & 1U) == 0);
  }
  return 0;
}

Assistant:

int WaveBackend::mixerProc()
{
    const milliseconds restTime{mDevice->UpdateSize*1000/mDevice->Frequency / 2};

    althrd_setname(MIXER_THREAD_NAME);

    const size_t frameStep{mDevice->channelsFromFmt()};
    const ALuint frameSize{mDevice->frameSizeFromFmt()};

    int64_t done{0};
    auto start = std::chrono::steady_clock::now();
    while(!mKillNow.load(std::memory_order_acquire) &&
          mDevice->Connected.load(std::memory_order_acquire))
    {
        auto now = std::chrono::steady_clock::now();

        /* This converts from nanoseconds to nanosamples, then to samples. */
        int64_t avail{std::chrono::duration_cast<seconds>((now-start) *
            mDevice->Frequency).count()};
        if(avail-done < mDevice->UpdateSize)
        {
            std::this_thread::sleep_for(restTime);
            continue;
        }
        while(avail-done >= mDevice->UpdateSize)
        {
            mDevice->renderSamples(mBuffer.data(), mDevice->UpdateSize, frameStep);
            done += mDevice->UpdateSize;

            if /*constexpr*/(!IS_LITTLE_ENDIAN)
            {
                const ALuint bytesize{mDevice->bytesFromFmt()};

                if(bytesize == 2)
                {
                    ALushort *samples = reinterpret_cast<ALushort*>(mBuffer.data());
                    const size_t len{mBuffer.size() / 2};
                    for(size_t i{0};i < len;i++)
                    {
                        const ALushort samp{samples[i]};
                        samples[i] = static_cast<ALushort>((samp>>8) | (samp<<8));
                    }
                }
                else if(bytesize == 4)
                {
                    ALuint *samples = reinterpret_cast<ALuint*>(mBuffer.data());
                    const size_t len{mBuffer.size() / 4};
                    for(size_t i{0};i < len;i++)
                    {
                        const ALuint samp{samples[i]};
                        samples[i] = (samp>>24) | ((samp>>8)&0x0000ff00) |
                                     ((samp<<8)&0x00ff0000) | (samp<<24);
                    }
                }
            }

            size_t fs{fwrite(mBuffer.data(), frameSize, mDevice->UpdateSize, mFile)};
            (void)fs;
            if(ferror(mFile))
            {
                ERR("Error writing to file\n");
                mDevice->handleDisconnect("Failed to write playback samples");
                break;
            }
        }

        /* For every completed second, increment the start time and reduce the
         * samples done. This prevents the difference between the start time
         * and current time from growing too large, while maintaining the
         * correct number of samples to render.
         */
        if(done >= mDevice->Frequency)
        {
            seconds s{done/mDevice->Frequency};
            start += s;
            done -= mDevice->Frequency*s.count();
        }
    }

    return 0;
}